

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O0

ion_status_t linear_hash_get(ion_byte_t *key,ion_byte_t *value,linear_hash_table_t *linear_hash)

{
  int iVar1;
  int iVar2;
  ion_key_size_t iVar3;
  FILE *pFVar4;
  size_t __size;
  ion_dictionary_compare_t p_Var5;
  long lVar6;
  long lVar7;
  long lVar8;
  ion_fpos_t __ptr;
  ion_byte_t *piVar9;
  undefined8 bucket_loc_00;
  byte bVar10;
  char cVar11;
  ion_err_t iVar12;
  ion_byte_t *__s;
  long lVar13;
  bool bVar14;
  ion_byte_t aiStack_90 [14];
  bool local_82;
  char local_81;
  long lStack_80;
  ion_boolean_t terminal;
  ion_fpos_t record_loc;
  ion_fpos_t record_offset;
  ion_byte_t *records;
  int local_60;
  int i;
  int found;
  ion_byte_t record_status;
  ion_byte_t *record_value;
  ion_byte_t *record_key;
  linear_hash_bucket_t bucket;
  ion_fpos_t bucket_loc;
  int bucket_idx;
  linear_hash_table_t *linear_hash_local;
  ion_byte_t *value_local;
  ion_byte_t *key_local;
  ion_status_t status;
  
  builtin_memcpy(aiStack_90,"?5\x11",4);
  aiStack_90[4] = '\0';
  aiStack_90[5] = '\0';
  aiStack_90[6] = '\0';
  aiStack_90[7] = '\0';
  bucket_loc._4_4_ = insert_hash_to_bucket(key,linear_hash);
  if (bucket_loc._4_4_ < linear_hash->next_split) {
    builtin_memcpy(aiStack_90,"[5\x11",4);
    aiStack_90[4] = '\0';
    aiStack_90[5] = '\0';
    aiStack_90[6] = '\0';
    aiStack_90[7] = '\0';
    bucket_loc._4_4_ = hash_to_bucket(key,linear_hash);
  }
  builtin_memcpy(aiStack_90,"j5\x11",4);
  aiStack_90[4] = '\0';
  aiStack_90[5] = '\0';
  aiStack_90[6] = '\0';
  aiStack_90[7] = '\0';
  bucket.overflow_location = bucket_idx_to_ion_fpos_t(bucket_loc._4_4_,linear_hash);
  builtin_memcpy(aiStack_90,"\x7f5\x11",4);
  aiStack_90[4] = '\0';
  aiStack_90[5] = '\0';
  aiStack_90[6] = '\0';
  aiStack_90[7] = '\0';
  bVar10 = linear_hash_get_bucket
                     (bucket.overflow_location,(linear_hash_bucket_t *)&record_key,linear_hash);
  key_local = (ion_byte_t *)(ulong)bVar10;
  if (bVar10 == 0) {
    lVar8 = 8 - ((long)(linear_hash->super).record.key_size + 0xfU & 0xfffffffffffffff0);
    record_value = aiStack_90 + lVar8;
    lVar6 = -((long)(linear_hash->super).record.value_size + 0xfU & 0xfffffffffffffff0);
    _found = record_value + lVar6;
    i._3_1_ = '\0';
    local_60 = 0;
    lVar7 = -(linear_hash->record_total_size * (long)linear_hash->records_per_bucket + 0xfU &
             0xfffffffffffffff0);
    __s = _found + lVar7;
    lVar13 = linear_hash->record_total_size;
    iVar1 = linear_hash->records_per_bucket;
    record_offset = (ion_fpos_t)__s;
    builtin_memcpy(aiStack_90 + lVar7 + lVar6 + lVar8 + -8,"\x196\x11",4);
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    memset(__s,0,lVar13 * iVar1);
    record_loc = 0;
    local_81 = '\0';
LAB_00113625:
    do {
      do {
        local_82 = local_81 == '\0' && local_60 == 0;
        if (local_81 != '\0' || local_60 != 0) {
          bVar14 = key_local._4_4_ == 0;
          if (bVar14) {
            key_local = (ion_byte_t *)CONCAT71(key_local._1_7_,1);
            return (ion_status_t)key_local;
          }
          key_local = (ion_byte_t *)((ulong)key_local._1_7_ << 8);
          return (ion_status_t)key_local;
        }
        lStack_80 = bucket.overflow_location + 0x10;
        pFVar4 = (FILE *)linear_hash->database;
        lVar13 = bucket.overflow_location + 0x10;
        builtin_memcpy(aiStack_90 + lVar7 + lVar6 + lVar8 + -8,"l6\x11",4);
        __s[-4] = '\0';
        __s[-3] = '\0';
        __s[-2] = '\0';
        __s[-1] = '\0';
        fseek(pFVar4,lVar13,0);
        __ptr = record_offset;
        __size = linear_hash->record_total_size;
        iVar1 = linear_hash->records_per_bucket;
        pFVar4 = (FILE *)linear_hash->database;
        __s[-8] = 0x8d;
        __s[-7] = '6';
        __s[-6] = '\x11';
        __s[-5] = '\0';
        __s[-4] = '\0';
        __s[-3] = '\0';
        __s[-2] = '\0';
        __s[-1] = '\0';
        fread((void *)__ptr,__size,(long)iVar1,pFVar4);
        for (records._4_4_ = 0; piVar9 = record_value,
            records._4_4_ < linear_hash->records_per_bucket; records._4_4_ = records._4_4_ + 1) {
          i._3_1_ = *(char *)(record_offset + record_loc);
          lVar13 = record_offset + record_loc;
          iVar1 = (linear_hash->super).record.key_size;
          __s[-8] = 0xcf;
          __s[-7] = '6';
          __s[-6] = '\x11';
          __s[-5] = '\0';
          __s[-4] = '\0';
          __s[-3] = '\0';
          __s[-2] = '\0';
          __s[-1] = '\0';
          memcpy(piVar9,(void *)(lVar13 + 1),(long)iVar1);
          piVar9 = _found;
          lVar13 = record_offset + record_loc;
          iVar1 = (linear_hash->super).record.key_size;
          iVar2 = (linear_hash->super).record.value_size;
          __s[-8] = 0xf7;
          __s[-7] = '6';
          __s[-6] = '\x11';
          __s[-5] = '\0';
          __s[-4] = '\0';
          __s[-3] = '\0';
          __s[-2] = '\0';
          __s[-1] = '\0';
          memcpy(piVar9,(void *)(lVar13 + 1 + (long)iVar1),(long)iVar2);
          piVar9 = record_value;
          if (i._3_1_ != '\0') {
            p_Var5 = (linear_hash->super).compare;
            iVar3 = (linear_hash->super).record.key_size;
            builtin_memcpy(aiStack_90 + lVar7 + lVar6 + lVar8 + -8,"\x197\x11",4);
            __s[-4] = '\0';
            __s[-3] = '\0';
            __s[-2] = '\0';
            __s[-1] = '\0';
            cVar11 = (*p_Var5)(piVar9,key,iVar3);
            piVar9 = _found;
            if (cVar11 == '\0') {
              key_local = (ion_byte_t *)((ulong)(key_local._4_4_ + 1) << 0x20);
              iVar1 = (linear_hash->super).record.value_size;
              builtin_memcpy(aiStack_90 + lVar7 + lVar6 + lVar8 + -8,"?7\x11",4);
              __s[-4] = '\0';
              __s[-3] = '\0';
              __s[-2] = '\0';
              __s[-1] = '\0';
              memcpy(value,piVar9,(long)iVar1);
              local_60 = 1;
              break;
            }
          }
          record_loc = linear_hash->record_total_size + record_loc;
          lStack_80 = linear_hash->record_total_size + lStack_80;
        }
        bucket_loc_00 = bucket._0_8_;
      } while (local_60 != 0);
      if (bucket._0_8_ == -1) {
        local_81 = '\x01';
        goto LAB_00113625;
      }
      record_loc = 0;
      bucket.overflow_location._0_4_ = bucket.idx;
      bucket.overflow_location._4_4_ = bucket.record_count;
      __s[-8] = 0xac;
      __s[-7] = '7';
      __s[-6] = '\x11';
      __s[-5] = '\0';
      __s[-4] = '\0';
      __s[-3] = '\0';
      __s[-2] = '\0';
      __s[-1] = '\0';
      iVar12 = linear_hash_get_bucket(bucket_loc_00,(linear_hash_bucket_t *)&record_key,linear_hash)
      ;
      key_local = (ion_byte_t *)CONCAT71(key_local._1_7_,iVar12);
    } while (iVar12 == '\0');
  }
  return (ion_status_t)key_local;
}

Assistant:

ion_status_t
linear_hash_get(
	ion_byte_t			*key,
	ion_byte_t			*value,
	linear_hash_table_t *linear_hash
) {
	/* status for result count */
	ion_status_t status = ION_STATUS_INITIALIZE;
	/* get the index of the bucket to read */
	int bucket_idx		= insert_hash_to_bucket(key, linear_hash);

	if (bucket_idx < linear_hash->next_split) {
		bucket_idx = hash_to_bucket(key, linear_hash);
	}

	/* get the bucket where the record would be located */
	ion_fpos_t				bucket_loc = bucket_idx_to_ion_fpos_t(bucket_idx, linear_hash);
	linear_hash_bucket_t	bucket;

	status.error = linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

	if (status.error != err_ok) {
		return status;
	}

	/* create a linear_hash_record with the desired key, value, and status of full*/
	ion_byte_t	*record_key		= alloca(linear_hash->super.record.key_size);
	ion_byte_t	*record_value	= alloca(linear_hash->super.record.value_size);
	ion_byte_t	record_status	= linear_hash_record_status_empty;

	int found					= boolean_false;
	int i;

	ion_byte_t *records			= alloca(linear_hash->record_total_size * linear_hash->records_per_bucket);

	memset(records, 0, linear_hash->record_total_size * linear_hash->records_per_bucket);

	ion_fpos_t		record_offset	= 0;
	ion_fpos_t		record_loc;
	ion_boolean_t	terminal		= boolean_false;

	while (terminal == boolean_false && found == boolean_false) {
		record_loc = bucket_loc + sizeof(linear_hash_bucket_t);
		fseek(linear_hash->database, bucket_loc + sizeof(linear_hash_bucket_t), SEEK_SET);
		fread(records, linear_hash->record_total_size, linear_hash->records_per_bucket, linear_hash->database);

		for (i = 0; i < linear_hash->records_per_bucket; i++) {
			memcpy(&record_status, records + record_offset, sizeof(record_status));
			memcpy(record_key, records + record_offset + sizeof(record_status), linear_hash->super.record.key_size);
			memcpy(record_value, records + record_offset + sizeof(record_status) + linear_hash->super.record.key_size, linear_hash->super.record.value_size);

			if (record_status != 0) {
				if (linear_hash->super.compare(record_key, key, linear_hash->super.record.key_size) == 0) {
					status.count++;
					memcpy(value, record_value, linear_hash->super.record.value_size);
					found = 1;
					break;
				}
			}

			record_offset	+= linear_hash->record_total_size;
			record_loc		+= linear_hash->record_total_size;
		}

		if (found == boolean_false) {
			if (bucket.overflow_location == linear_hash_end_of_list) {
				terminal = boolean_true;
			}
			else {
				record_offset	= 0;
				bucket_loc		= bucket.overflow_location;
				status.error	= linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

				if (status.error != err_ok) {
					return status;
				}
			}
		}
	}

	if (status.count == 0) {
		status.error = err_item_not_found;
	}
	else {
		status.error = err_ok;
	}

	return status;
}